

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_cte.cpp
# Opt level: O2

void __thiscall
duckdb::Transformer::TransformCTE
          (Transformer *this,PGWithClause *de_with_clause,CommonTableExpressionMap *cte_map)

{
  PGCTEMaterialize PVar1;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  templated_unique_single_t __p;
  undefined8 uVar3;
  undefined8 this_00;
  _Alloc_hider _Var4;
  PGCommonTableExpr *info_00;
  pointer pCVar5;
  PGValue *pPVar6;
  iterator iVar7;
  __uniq_ptr_impl<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
  *this_01;
  NotImplementedException *pNVar8;
  ParserException *this_02;
  CTEMaterialize CVar9;
  PGList *pPVar10;
  PGList *pPVar11;
  allocator local_161;
  Transformer *local_160;
  templated_unique_single_t info;
  undefined1 local_150 [48];
  string cte_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_160 = this;
  cte_name._M_dataplus._M_p = (pointer)cte_map;
  ::std::vector<duckdb::CommonTableExpressionMap*,std::allocator<duckdb::CommonTableExpressionMap*>>
  ::emplace_back<duckdb::CommonTableExpressionMap*>
            ((vector<duckdb::CommonTableExpressionMap*,std::allocator<duckdb::CommonTableExpressionMap*>>
              *)&this->stored_cte_map,(CommonTableExpressionMap **)&cte_name);
  pPVar11 = de_with_clause->ctes;
  local_150._32_8_ = de_with_clause;
  local_150._40_8_ = cte_map;
  do {
    pPVar11 = (PGList *)pPVar11->head;
    if (pPVar11 == (PGList *)0x0) {
      return;
    }
    make_uniq<duckdb::CommonTableExpressionInfo>();
    cte_name._M_dataplus._M_p = *(pointer *)pPVar11;
    info_00 = optional_ptr<duckdb_libpgquery::PGCommonTableExpr,_true>::operator*
                        ((optional_ptr<duckdb_libpgquery::PGCommonTableExpr,_true> *)&cte_name);
    pPVar10 = info_00->recursive_keys;
    if ((pPVar10->head->data).ptr_value != (void *)0x0) {
      pCVar5 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                             *)&info.
                                super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                           );
      TransformExpressionList(local_160,pPVar10,&pCVar5->key_targets);
    }
    pPVar10 = info_00->aliascolnames;
    if (pPVar10 != (PGList *)0x0) {
      while (pPVar10 = (PGList *)pPVar10->head, pPVar10 != (PGList *)0x0) {
        cte_name._M_dataplus._M_p = *(pointer *)pPVar10;
        pCVar5 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                               *)&info.
                                  super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                             );
        pPVar6 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
                           ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&cte_name);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pCVar5,
                   &(pPVar6->val).str);
      }
    }
    this_00 = local_150._40_8_;
    if (info_00->ctecolnames != (PGList *)0x0) {
      pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&cte_name,"Column name setting not supported in CTEs",
                 (allocator *)local_150);
      NotImplementedException::NotImplementedException(pNVar8,&cte_name);
      __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (info_00->ctecoltypes != (PGList *)0x0) {
      pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&cte_name,"Column type setting not supported in CTEs",
                 (allocator *)local_150);
      NotImplementedException::NotImplementedException(pNVar8,&cte_name);
      __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (info_00->ctecoltypmods != (PGList *)0x0) {
      pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&cte_name,"Column type modification not supported in CTEs",
                 (allocator *)local_150);
      NotImplementedException::NotImplementedException(pNVar8,&cte_name);
      __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (info_00->ctecolcollations != (PGList *)0x0) {
      pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&cte_name,"CTE collations not supported",(allocator *)local_150);
      NotImplementedException::NotImplementedException(pNVar8,&cte_name);
      __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((info_00->ctequery == (PGNode *)0x0) || (info_00->ctequery->type != T_PGSelectStmt)) {
      pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&cte_name,"A CTE needs a SELECT",(allocator *)local_150);
      NotImplementedException::NotImplementedException(pNVar8,&cte_name);
      __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((info_00->cterecursive == false) && (*(bool *)(local_150._32_8_ + 0x10) != true)) {
      Transformer((Transformer *)&cte_name,local_160);
      TransformSelectStmt((Transformer *)local_150,(PGNode *)&cte_name,SUB81(info_00->ctequery,0));
      pCVar5 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                             *)&info.
                                super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                           );
      uVar3 = local_150._0_8_;
      local_150._0_8_ = (Transformer *)0x0;
      _Var2._M_head_impl =
           (pCVar5->query).
           super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
           .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
      (pCVar5->query).
      super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
      .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
           (SelectStatement *)uVar3;
      if (_Var2._M_head_impl != (SelectStatement *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_SQLStatement + 8))();
        if ((Transformer *)local_150._0_8_ != (Transformer *)0x0) {
          (**(code **)(*(long *)local_150._0_8_ + 8))();
        }
      }
      ~Transformer((Transformer *)&cte_name);
    }
    else {
      unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
      ::operator*((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                   *)&info.
                      super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                 );
      TransformRecursiveCTE
                ((Transformer *)&cte_name,(PGCommonTableExpr *)local_160,
                 (CommonTableExpressionInfo *)info_00);
      pCVar5 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                             *)&info.
                                super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                           );
      _Var4 = cte_name._M_dataplus;
      cte_name._M_dataplus._M_p = (pointer)0x0;
      _Var2._M_head_impl =
           (pCVar5->query).
           super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
           .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
      (pCVar5->query).
      super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
      .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
           (SelectStatement *)_Var4._M_p;
      if (_Var2._M_head_impl != (SelectStatement *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_SQLStatement + 8))();
        if (cte_name._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)cte_name._M_dataplus._M_p + 8))();
        }
      }
    }
    ::std::__cxx11::string::string((string *)&cte_name,info_00->ctename,(allocator *)local_150);
    iVar7 = InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
            ::find((InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
                    *)this_00,&cte_name);
    if (iVar7._M_current != *(pointer *)(this_00 + 8)) {
      this_02 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)local_150,"Duplicate CTE name \"%s\"",&local_161);
      ::std::__cxx11::string::string((string *)&local_50,(string *)&cte_name);
      ParserException::ParserException<std::__cxx11::string>(this_02,(string *)local_150,&local_50);
      __cxa_throw(this_02,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    PVar1 = info_00->ctematerialized;
    if (PVar1 == PGCTEMaterializeNever) {
      pCVar5 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                             *)&info.
                                super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                           );
      CVar9 = CTE_MATERIALIZE_NEVER;
LAB_01680c11:
      pCVar5->materialized = CVar9;
    }
    else {
      if (PVar1 == PGCTEMaterializeAlways) {
        pCVar5 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                               *)&info.
                                  super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                             );
        CVar9 = CTE_MATERIALIZE_ALWAYS;
        goto LAB_01680c11;
      }
      if (PVar1 == PGCTEMaterializeDefault) {
        pCVar5 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                               *)&info.
                                  super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                             );
        CVar9 = CTE_MATERIALIZE_DEFAULT;
        goto LAB_01680c11;
      }
    }
    this_01 = (__uniq_ptr_impl<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
               *)InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
                 ::operator[]((InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
                               *)this_00,&cte_name);
    __p = info;
    info.
    super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::CommonTableExpressionInfo_*,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
    .super__Head_base<0UL,_duckdb::CommonTableExpressionInfo_*,_false>._M_head_impl =
         (unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
          )(__uniq_ptr_data<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true,_true>
            )0x0;
    ::std::
    __uniq_ptr_impl<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
    ::reset(this_01,(pointer)__p.
                             super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::CommonTableExpressionInfo_*,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                             .super__Head_base<0UL,_duckdb::CommonTableExpressionInfo_*,_false>.
                             _M_head_impl);
    ::std::__cxx11::string::~string((string *)&cte_name);
    ::std::
    unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
    ::~unique_ptr(&info.
                   super_unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                 );
  } while( true );
}

Assistant:

void Transformer::TransformCTE(duckdb_libpgquery::PGWithClause &de_with_clause, CommonTableExpressionMap &cte_map) {
	stored_cte_map.push_back(&cte_map);

	// TODO: might need to update in case of future lawsuit
	D_ASSERT(de_with_clause.ctes);
	for (auto cte_ele = de_with_clause.ctes->head; cte_ele != nullptr; cte_ele = cte_ele->next) {
		auto info = make_uniq<CommonTableExpressionInfo>();

		auto &cte = *PGPointerCast<duckdb_libpgquery::PGCommonTableExpr>(cte_ele->data.ptr_value);

		auto key_target = PGPointerCast<duckdb_libpgquery::PGNode>(cte.recursive_keys->head->data.ptr_value);
		if (key_target) {
			TransformExpressionList(*cte.recursive_keys, info->key_targets);
		}

		if (cte.aliascolnames) {
			for (auto node = cte.aliascolnames->head; node != nullptr; node = node->next) {
				auto value = PGPointerCast<duckdb_libpgquery::PGValue>(node->data.ptr_value);
				info->aliases.emplace_back(value->val.str);
			}
		}
		// lets throw some errors on unsupported features early
		if (cte.ctecolnames) {
			throw NotImplementedException("Column name setting not supported in CTEs");
		}
		if (cte.ctecoltypes) {
			throw NotImplementedException("Column type setting not supported in CTEs");
		}
		if (cte.ctecoltypmods) {
			throw NotImplementedException("Column type modification not supported in CTEs");
		}
		if (cte.ctecolcollations) {
			throw NotImplementedException("CTE collations not supported");
		}
		// we need a query
		if (!cte.ctequery || cte.ctequery->type != duckdb_libpgquery::T_PGSelectStmt) {
			throw NotImplementedException("A CTE needs a SELECT");
		}

		// CTE transformation can either result in inlining for non recursive CTEs, or in recursive CTE bindings
		// otherwise.
		if (cte.cterecursive || de_with_clause.recursive) {
			info->query = TransformRecursiveCTE(cte, *info);
		} else {
			Transformer cte_transformer(*this);
			info->query = cte_transformer.TransformSelectStmt(*cte.ctequery);
		}
		D_ASSERT(info->query);
		auto cte_name = string(cte.ctename);

		auto it = cte_map.map.find(cte_name);
		if (it != cte_map.map.end()) {
			// can't have two CTEs with same name
			throw ParserException("Duplicate CTE name \"%s\"", cte_name);
		}

		if (cte.ctematerialized == duckdb_libpgquery::PGCTEMaterializeDefault) {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
			info->materialized = CTEMaterialize::CTE_MATERIALIZE_ALWAYS;
#else
			info->materialized = CTEMaterialize::CTE_MATERIALIZE_DEFAULT;
#endif
		} else if (cte.ctematerialized == duckdb_libpgquery::PGCTEMaterializeAlways) {
			info->materialized = CTEMaterialize::CTE_MATERIALIZE_ALWAYS;
		} else if (cte.ctematerialized == duckdb_libpgquery::PGCTEMaterializeNever) {
			info->materialized = CTEMaterialize::CTE_MATERIALIZE_NEVER;
		}

		cte_map.map[cte_name] = std::move(info);
	}
}